

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

int INT_CMConnection_set_character(CMConnection conn,attr_list attrs)

{
  int *piVar1;
  FILE *pFVar2;
  long *__ptr;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  int *client_data;
  attr_list p_Var7;
  CMTaskHandle p_Var8;
  long lVar9;
  int previous_interval;
  ssize_t interval_value;
  CMTaskHandle prior_task;
  timespec ts;
  uint local_5c;
  int local_58;
  undefined4 uStack_54;
  long local_50;
  long *local_48;
  timespec local_40;
  
  iVar4 = 0;
  if ((attrs != (attr_list)0x0) &&
     (iVar3 = get_long_attr(attrs,CM_BW_MEASURE_INTERVAL,&local_58), iVar4 = 0, iVar3 != 0)) {
    if (CONCAT44(uStack_54,local_58) - 0x7081U < 0xffffffffffff8f81) {
      iVar4 = 0;
      printf("Bad CM_BW_MEASURE_INTERVAL, %zd seconds\n");
    }
    else {
      iVar4 = CMtrace_val[3];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(conn->cm,CMLowLevelVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar2 = (FILE *)conn->cm->CMTrace_file;
          _Var5 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)conn->cm->CMTrace_file,"CM_BW_MEASURE_INTERVAL set, interval is %zd\n",
                CONCAT44(uStack_54,local_58));
      }
      fflush((FILE *)conn->cm->CMTrace_file);
      if ((conn->characteristics != (attr_list)0x0) &&
         (iVar4 = get_int_attr(conn->characteristics,CM_BW_MEASURE_INTERVAL,&local_5c), iVar4 != 0))
      {
        local_48 = (long *)0x0;
        local_50 = CONCAT44(uStack_54,local_58);
        lVar9 = (long)(int)local_5c;
        if (local_50 < lVar9) {
          iVar4 = CMtrace_val[3];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar4 = CMtrace_init(conn->cm,CMLowLevelVerbose);
          }
          if (iVar4 != 0) {
            if (CMtrace_PID != 0) {
              pFVar2 = (FILE *)conn->cm->CMTrace_file;
              _Var5 = getpid();
              pVar6 = pthread_self();
              fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_40);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,
                      local_40.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,
                    "CM_BW_MEASURE_INTERVAL prior interval is %d, killing prior task.\n",
                    (ulong)local_5c);
          }
          fflush((FILE *)conn->cm->CMTrace_file);
          get_long_attr(conn->characteristics,CM_BW_MEASURE_TASK,&local_48);
          __ptr = local_48;
          if (local_48 != (long *)0x0) {
            (**(code **)(*(long *)(*local_48 + 0x20) + 0x88))
                      (&CMstatic_trans_svcs,*(long *)(*local_48 + 0x20) + 0x58,local_48[1]);
            free(__ptr);
            set_long_attr(conn->characteristics,CM_BW_MEASURE_TASK,0);
          }
        }
        else {
          iVar4 = CMtrace_val[3];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar4 = CMtrace_init(conn->cm,CMLowLevelVerbose);
          }
          if (iVar4 != 0) {
            if (CMtrace_PID != 0) {
              pFVar2 = (FILE *)conn->cm->CMTrace_file;
              _Var5 = getpid();
              pVar6 = pthread_self();
              fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_40);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,
                      local_40.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,
                    "CM_BW_MEASURE_INTERVAL prior interval is %d, no action.\n",(ulong)local_5c);
          }
          fflush((FILE *)conn->cm->CMTrace_file);
        }
        if (lVar9 <= local_50) {
          return 1;
        }
      }
      client_data = (int *)INT_CMmalloc(0x20);
      piVar1 = client_data + 1;
      client_data[0] = -1;
      client_data[1] = -1;
      get_int_attr(attrs,CM_BW_MEASURE_SIZE,client_data);
      if (*client_data < 0x400) {
        *client_data = 0x400;
      }
      get_int_attr(attrs,CM_BW_MEASURE_SIZEINC,piVar1);
      if (*piVar1 < 0x400) {
        *piVar1 = 0x400;
      }
      client_data[2] = 0;
      client_data[3] = 0;
      *(CMConnection *)(client_data + 4) = conn;
      p_Var7 = CMint_attr_copy_list
                         (conn->cm,attrs,
                          "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                          ,0x4db);
      *(attr_list *)(client_data + 6) = p_Var7;
      p_Var8 = INT_CMadd_delayed_task(conn->cm,0,1000,do_bw_measure,client_data);
      free(p_Var8);
      p_Var8 = INT_CMadd_periodic_task(conn->cm,local_58,0,do_bw_measure,client_data);
      if (conn->characteristics == (attr_list)0x0) {
        p_Var7 = CMint_create_attr_list
                           (conn->cm,
                            "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                            ,0x4e4);
        conn->characteristics = p_Var7;
      }
      set_int_attr(conn->characteristics,CM_BW_MEASURE_INTERVAL,local_58);
      set_long_attr(conn->characteristics,CM_BW_MEASURE_TASK,p_Var8);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

extern int
 INT_CMConnection_set_character(CMConnection conn, attr_list attrs)
 {
     ssize_t interval_value;
     if (attrs == NULL) return 0;
     if (get_long_attr(attrs, CM_BW_MEASURE_INTERVAL, &interval_value)) {
	 bw_measure_data data;
	 int previous_interval;
	 CMTaskHandle task = NULL;
	 if ((interval_value <= 1) || (interval_value > 60*60*8)) {
	     printf("Bad CM_BW_MEASURE_INTERVAL, %zd seconds\n",
		    interval_value);
	     return 0;
	 }

	 CMtrace_out(conn->cm, CMLowLevelVerbose,"CM_BW_MEASURE_INTERVAL set, interval is %zd\n", interval_value);
	 if (conn->characteristics && 
	     (get_int_attr(conn->characteristics, CM_BW_MEASURE_INTERVAL,
			   &previous_interval) != 0)) {
	     CMTaskHandle prior_task = NULL;
	     if (interval_value >= previous_interval) {
		 CMtrace_out(conn->cm, CMLowLevelVerbose,"CM_BW_MEASURE_INTERVAL prior interval is %d, no action.\n", previous_interval);
		 return 1;
	     }
	     CMtrace_out(conn->cm, CMLowLevelVerbose,"CM_BW_MEASURE_INTERVAL prior interval is %d, killing prior task.\n", previous_interval);
	     get_long_attr(conn->characteristics, CM_BW_MEASURE_TASK,
			   (ssize_t*)(intptr_t)&prior_task);
	     if (prior_task) {
		 INT_CMremove_task(prior_task);
		 set_long_attr(conn->characteristics, CM_BW_MEASURE_TASK, (intptr_t)0);
	     }
	 }
	 data = malloc(sizeof(*data));
	 data->size=data->size_inc=-1;

	 /*Get attr about size, size_inc from attributes. */
	 get_int_attr(attrs, CM_BW_MEASURE_SIZE, &(data->size));
	 if(data->size<1024)
	     data->size=1024;
	 get_int_attr(attrs, CM_BW_MEASURE_SIZEINC, &(data->size_inc));
	 if(data->size_inc<1024)
	     data->size_inc=1024;

	 data->successful_run=0;
	 data->failed_run=0;

	 /*app set attr about N and repeat time. store in data->attrs automically and pass to regressive_probe_bandwidth. 
	  */
	 data->conn = conn;
	 data->attrs = CMattr_copy_list(conn->cm, attrs);
	 /* do one task almost immediately */
	 task = INT_CMadd_delayed_task(conn->cm, 0, 1000, do_bw_measure, 
				   (void*)data);
	 free(task);
	 /* schedule tasks periodically */
	 task = INT_CMadd_periodic_task(conn->cm, (int)interval_value, 0, 
				    do_bw_measure, (void*)data);
	 if (conn->characteristics == NULL) {
	     conn->characteristics = CMcreate_attr_list(conn->cm);
	 }
	 set_int_attr(conn->characteristics, CM_BW_MEASURE_INTERVAL,
		      (int)interval_value);
	 set_long_attr(conn->characteristics, CM_BW_MEASURE_TASK, (intptr_t)task);

	 return 1;
     }
     return 0;
 }